

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

void __thiscall Graph<Node>::resize(Graph<Node> *this,int newSize)

{
  this->_nodeCnt = newSize;
  vector<NodeList<Node>_>::resize(&this->G,newSize);
  initializeRoyFloyd(this);
  return;
}

Assistant:

void resize(int newSize) {
        _nodeCnt = newSize;
        G.resize(newSize);
        initializeRoyFloyd();
    }